

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Directory::ComputeRelativePathTopSource(Directory *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  pointer this_01;
  PointerType pBVar3;
  allocator local_121;
  Directory local_120;
  undefined1 local_f8 [8];
  string currentSource;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_d0;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_c8;
  __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_c0;
  const_iterator it;
  Directory local_b0;
  undefined1 local_88 [8];
  string result;
  undefined1 local_40 [8];
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  Snapshot snapshot;
  Directory *this_local;
  
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->Snapshot_).State;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::vector
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40,
             (value_type *)
             &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    Snapshot::GetBuildsystemDirectoryParent
              ((Snapshot *)((long)&result.field_2 + 8),
               (Snapshot *)
               &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)result.field_2._8_8_;
    bVar1 = Snapshot::IsValid((Snapshot *)
                              &snapshots.
                               super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40,
               (value_type *)
               &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::front
                      ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  Snapshot::GetDirectory(&local_b0,this_00);
  pcVar2 = GetCurrentSource(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,pcVar2,(allocator *)((long)&it._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_d0._M_current =
       (Snapshot *)
       std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::begin
                 ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  local_c8 = __gnu_cxx::
             __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
             ::operator+(&local_d0,1);
  __gnu_cxx::
  __normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
  ::__normal_iterator<cmState::Snapshot*>
            ((__normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
              *)&local_c0,&local_c8);
  while( true ) {
    currentSource.field_2._8_8_ =
         std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::end
                   ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
                        *)((long)&currentSource.field_2 + 8));
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
              ::operator->(&local_c0);
    Snapshot::GetDirectory(&local_120,this_01);
    pcVar2 = GetCurrentSource(&local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f8,pcVar2,&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,(string *)local_f8);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_f8);
    }
    std::__cxx11::string::~string((string *)local_f8);
    __gnu_cxx::
    __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
    ::operator++(&local_c0);
  }
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::operator=((string *)&pBVar3->RelativePathTopSource,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~vector
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  return;
}

Assistant:

void cmState::Directory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmState::Snapshot snapshot = this->Snapshot_;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentSource = it->GetDirectory().GetCurrentSource();
    if(cmSystemTools::IsSubDirectory(result, currentSource))
      {
      result = currentSource;
      }
    }
  this->DirectoryState->RelativePathTopSource = result;
}